

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

int __thiscall chaiscript::Boxed_Number::get_as<int>(Boxed_Number *this)

{
  Common_Types CVar1;
  uint uVar2;
  bad_any_cast *this_00;
  
  CVar1 = get_common_type(&this->bv);
  switch(CVar1) {
  case t_int32:
  case t_uint32:
  case t_uint64:
  case t_int64:
    uVar2 = *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_double:
    uVar2 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    break;
  case t_uint8:
    uVar2 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    break;
  case t_int8:
    uVar2 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    break;
  case t_uint16:
    uVar2 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    break;
  case t_int16:
    uVar2 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    break;
  case t_float:
    uVar2 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    break;
  case t_long_double:
    uVar2 = (uint)ROUND(*((this->bv).m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->m_const_data_ptr);
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  return uVar2;
}

Assistant:

Target get_as() const
      {
        switch (get_common_type(bv)) {
          case Common_Types::t_int32:
            return get_as_aux<Target, int32_t>(bv);
          case Common_Types::t_uint8:
            return get_as_aux<Target, uint8_t>(bv);
          case Common_Types::t_int8:
            return get_as_aux<Target, int8_t>(bv);
          case Common_Types::t_uint16:
            return get_as_aux<Target, uint16_t>(bv);
          case Common_Types::t_int16:
            return get_as_aux<Target, int16_t>(bv);
          case Common_Types::t_uint32:
            return get_as_aux<Target, uint32_t>(bv);
          case Common_Types::t_uint64:
            return get_as_aux<Target, uint64_t>(bv);
          case Common_Types::t_int64:
            return get_as_aux<Target, int64_t>(bv);
          case Common_Types::t_double:
            return get_as_aux<Target, double>(bv);
          case Common_Types::t_float:
            return get_as_aux<Target, float>(bv);
          case Common_Types::t_long_double:
            return get_as_aux<Target, long double>(bv);
        }

        throw chaiscript::detail::exception::bad_any_cast();
      }